

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O0

void __thiscall
ChunkedSequenceResize_TwoElementsDownToOne_Test::TestBody
          (ChunkedSequenceResize_TwoElementsDownToOne_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference lhs;
  Message *message;
  _Tuple_impl<0UL,_int,_int> in_stack_fffffffffffffd90;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1d0 [2];
  testing local_1c8 [8];
  char local_1c0 [8];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_1a0;
  Message local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_168 [8];
  const_iterator it;
  Message local_150;
  uint local_144;
  size_t local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  uint local_114;
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  uint local_c4;
  size_type local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  uint local_94;
  size_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  uint local_64;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  int local_34;
  undefined1 local_30 [8];
  cseq_int cs;
  ChunkedSequenceResize_TwoElementsDownToOne_Test *this_local;
  
  cs.size_ = (size_type)this;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunked_sequence
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_34 = 0x11;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,&local_34);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x13;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,(int *)&gtest_ar.message_);
  local_60 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_64 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_58,"cs.chunks_size ()","1U",&local_60,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::resize
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,1);
  local_90 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunks_size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_94 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_88,"cs.chunks_size ()","1U",&local_90,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c0 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::size
                       ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_c4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_b8,"cs.size ()","1U",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::begin<pstore::chunked_sequence<int,2ul,4ul,4ul>>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_100);
  std::end<pstore::chunked_sequence<int,2ul,4ul,4ul>>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_110);
  local_100._16_8_ =
       std::distance<pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
                 ((iterator_base<false> *)local_100,(iterator_base<false> *)local_110);
  local_114 = 1;
  testing::internal::EqHelper::Compare<long,_unsigned_int,_nullptr>
            ((EqHelper *)local_e8,"std::distance (std::begin (cs), std::end (cs))","1U",
             (long *)(local_100 + 0x10),&local_114);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_140 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::capacity
                        ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  local_144 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_138,"cs.capacity ()","2U",&local_140,&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it.index_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it.index_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it.index_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)&gtest_ar_5.message_);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::iterator_base
            ((iterator_base<true> *)local_168,(iterator_base<false> *)&gtest_ar_5.message_);
  lhs = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*
                  ((iterator_base<true> *)local_168);
  local_18c = 0x11;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_188,"*it","17",lhs,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    message = testing::Message::operator<<(&local_198,(char (*) [29])"Element 0 (chunk 0, index 0)")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x13e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,message);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x17;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30,
             (int *)((long)&gtest_ar_6.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_1d0[1] = 0x11;
  local_1d0[0] = 0x17;
  testing::ElementsAre<int,int>(local_1c8,local_1d0 + 1,local_1d0);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>
            ((ElementsAreMatcher<std::tuple<int,_int>_>)in_stack_fffffffffffffd90);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(local_1b8,local_1c0,(chunked_sequence<int,_2UL,_4UL,_4UL> *)"cs");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::~chunked_sequence
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_30);
  return;
}

Assistant:

TEST (ChunkedSequenceResize, TwoElementsDownToOne) {
    cseq_int cs;
    cs.emplace_back (17);
    cs.emplace_back (19);
    // Before: [ 17, 19 ]
    EXPECT_EQ (cs.chunks_size (), 1U);
    // After: [ 17, _ ]
    cs.resize (1U);
    EXPECT_EQ (cs.chunks_size (), 1U);
    EXPECT_EQ (cs.size (), 1U);
    EXPECT_EQ (std::distance (std::begin (cs), std::end (cs)), 1U);
    EXPECT_EQ (cs.capacity (), 2U);

    cseq_int::const_iterator it = cs.begin ();
    EXPECT_EQ (*it, 17) << "Element 0 (chunk 0, index 0)";

    cs.emplace_back (23);
    EXPECT_THAT (cs, testing::ElementsAre (17, 23));
}